

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O0

UBool icu_63::isWellFormed(UnicodeString *s)

{
  UBool UVar1;
  int32_t srcLength;
  char16_t *p;
  UChar *pSrc;
  bool local_15;
  UErrorCode local_14;
  UnicodeString *pUStack_10;
  UErrorCode errorCode;
  UnicodeString *s_local;
  
  local_14 = U_ZERO_ERROR;
  pUStack_10 = s;
  p = UnicodeString::getBuffer(s);
  pSrc = toUCharPtr(p);
  srcLength = UnicodeString::length(pUStack_10);
  u_strToUTF8_63((char *)0x0,0,(int32_t *)0x0,pSrc,srcLength,&local_14);
  UVar1 = ::U_SUCCESS(local_14);
  local_15 = UVar1 != '\0' || local_14 == U_BUFFER_OVERFLOW_ERROR;
  return local_15;
}

Assistant:

static UBool isWellFormed(const UnicodeString &s) {
    UErrorCode errorCode=U_ZERO_ERROR;
    u_strToUTF8(NULL, 0, NULL, toUCharPtr(s.getBuffer()), s.length(), &errorCode);
    return U_SUCCESS(errorCode) || errorCode==U_BUFFER_OVERFLOW_ERROR;
}